

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_decoder.c
# Opt level: O2

lzma_ret delta_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  lzma_ret lVar4;
  uint8_t uVar5;
  size_t sVar6;
  
  if (*(code **)((long)coder_ptr + 0x18) != (code *)0x0) {
    sVar6 = *out_pos;
    lVar4 = (**(code **)((long)coder_ptr + 0x18))(*coder_ptr);
    sVar3 = *out_pos;
    bVar1 = *(byte *)((long)coder_ptr + 0x48);
    for (; sVar3 != sVar6; sVar6 = sVar6 + 1) {
      bVar2 = *(byte *)((long)coder_ptr + 0x50);
      uVar5 = out[sVar6] +
              *(char *)((long)coder_ptr + (ulong)((uint)bVar2 + (uint)bVar1 & 0xff) + 0x51);
      out[sVar6] = uVar5;
      *(byte *)((long)coder_ptr + 0x50) = bVar2 - 1;
      *(uint8_t *)((long)coder_ptr + (ulong)bVar2 + 0x51) = uVar5;
    }
    return lVar4;
  }
  __assert_fail("coder->next.code != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/delta/delta_decoder.c"
                ,0x25,
                "lzma_ret delta_decode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
               );
}

Assistant:

static lzma_ret
delta_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_delta_coder *coder = coder_ptr;

	assert(coder->next.code != NULL);

	const size_t out_start = *out_pos;

	const lzma_ret ret = coder->next.code(coder->next.coder, allocator,
			in, in_pos, in_size, out, out_pos, out_size,
			action);

	decode_buffer(coder, out + out_start, *out_pos - out_start);

	return ret;
}